

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle_default.cpp
# Opt level: O3

StyleSheet * __thiscall
QStyleSheetStyle::getDefaultStyleSheet(StyleSheet *__return_storage_ptr__,QStyleSheetStyle *this)

{
  QList<QCss::Declaration> *pQVar1;
  QList<QCss::Pseudo> *pQVar2;
  QList<QCss::AttributeSelector> *this_00;
  QStyle *pQVar3;
  long lVar4;
  QList<QCss::Value> *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QLatin1String QVar42;
  QLatin1String QVar43;
  QLatin1String QVar44;
  QLatin1String QVar45;
  QLatin1String QVar46;
  QLatin1String QVar47;
  QLatin1String QVar48;
  QLatin1String QVar49;
  QLatin1String QVar50;
  QLatin1String QVar51;
  QLatin1String QVar52;
  QLatin1String QVar53;
  QLatin1String QVar54;
  QLatin1String QVar55;
  QLatin1String QVar56;
  QLatin1String QVar57;
  QLatin1String QVar58;
  QLatin1String QVar59;
  QLatin1String QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QArrayData *local_1e8 [3];
  Declaration local_1d0;
  QArrayDataPointer<QCss::BasicSelector> local_1c8;
  AttributeSelector local_1a8;
  Pseudo local_168;
  BasicSelector local_128;
  StyleRule local_b8;
  QVariant local_80;
  Value local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(__return_storage_ptr__,0,0xa0);
  local_b8.selectors.d.d = (Data *)0x0;
  local_b8.selectors.d.ptr = (Selector *)0x0;
  local_b8.selectors.d.size = 0;
  local_b8.declarations.d.d = (Data *)0x0;
  local_b8.declarations.d.ptr = (Declaration *)0x0;
  local_b8.declarations.d.size = 0;
  local_b8.order = 0;
  local_b8._52_4_ = 0xaaaaaaaa;
  local_128.elementName.d.d = (Data *)0x0;
  local_128.elementName.d.ptr = (char16_t *)0x0;
  local_128.elementName.d.size = 0;
  local_128.ids.d.d = (Data *)0x0;
  local_128.ids.d.ptr = (QString *)0x0;
  local_128.ids.d.size = 0;
  local_128.pseudos.d.d = (Data *)0x0;
  local_128.pseudos.d.ptr = (Pseudo *)0x0;
  local_128.pseudos.d.size = 0;
  local_128.attributeSelectors.d.d = (Data *)0x0;
  local_128.attributeSelectors.d.ptr = (AttributeSelector *)0x0;
  local_128.attributeSelectors.d.size = 0;
  local_128.relationToNext = NoRelation;
  local_128._100_4_ = 0xaaaaaaaa;
  local_1c8.size = 0;
  local_1c8.d = (Data *)0x0;
  local_1c8.ptr = (BasicSelector *)0x0;
  local_1d0.d.d.ptr =
       (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)operator_new(0x68);
  *(int *)local_1d0.d.d.ptr = 0;
  ((int *)((long)local_1d0.d.d.ptr + 8))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 8))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x10))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x10))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x14))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x14))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x1c))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x1c))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x28))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x28))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x30))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x30))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x38))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x38))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x40))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x40))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x48))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x48))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x50))[0] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x50))[1] = 0;
  ((int *)((long)local_1d0.d.d.ptr + 0x58))[0] = 2;
  ((int *)((long)local_1d0.d.d.ptr + 0x58))[1] = 0;
  *(undefined1 *)((long)local_1d0.d.d.ptr + 0x60) = 0;
  LOCK();
  *(int *)local_1d0.d.d.ptr = *(int *)local_1d0.d.d.ptr + 1;
  UNLOCK();
  local_60.type = Unknown;
  local_60._4_4_ = 0xaaaaaaaa;
  local_60.variant.d.data.shared = (PrivateShared *)0x0;
  local_60.variant.d.data._8_8_ = 0;
  local_60.variant.d.data._16_8_ = 0;
  local_60.variant.d._24_8_ = 2;
  local_168._57_7_ = 0xaaaaaaaaaaaaaa;
  local_168.type = 0;
  local_168.name.d.d = (Data *)0x0;
  local_168.name.d.ptr = (char16_t *)0x0;
  local_168.name.d.size = 0;
  local_168.function.d.d = (Data *)0x0;
  local_168.function.d.ptr._0_1_ = 0;
  local_168.function.d.ptr._1_7_ = 0;
  local_168.function.d.size._0_1_ = 0;
  local_168.function.d.size._1_7_ = 0;
  local_168.negated = false;
  local_1a8.name.d.d = (Data *)0x0;
  local_1a8.name.d.ptr = (char16_t *)0x0;
  local_1a8.name.d.size = 0;
  local_1a8.value.d.d = (Data *)0x0;
  local_1a8.value.d.ptr = (char16_t *)0x0;
  local_1a8.value.d.size = 0;
  local_1a8.valueMatchCriterium = NoMatch;
  local_1a8._52_4_ = 0xaaaaaaaa;
  pQVar3 = baseStyle(this);
  lVar4 = (**(code **)(*(long *)pQVar3 + 8))(pQVar3,"QMacStyle");
  bVar6 = true;
  if (lVar4 == 0) {
    pQVar3 = baseStyle(this);
    lVar4 = (**(code **)(*(long *)pQVar3 + 8))(pQVar3,"QWindowsVistaStyle");
    if (lVar4 == 0) {
      bVar6 = false;
    }
    else {
      pQVar3 = baseStyle(this);
      lVar4 = (**(code **)(*(long *)pQVar3 + 8))(pQVar3,"QWindows11Style");
      bVar6 = lVar4 == 0;
    }
  }
  QVar7.m_data = "QLineEdit";
  QVar7.m_size = 9;
  QString::operator=(&local_128.elementName,QVar7);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar8.m_data = "-qt-background-role";
  QVar8.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar8);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x44);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  pQVar1 = &local_b8.declarations;
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QVar9.m_data = "border";
  QVar9.m_size = 6;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar9);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Border;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QVar10.m_data = "-qt-style-features";
  QVar10.m_size = 0x12;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar10);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtStyleFeatures;
  local_60.type = Identifier;
  QVar61.m_data = (storage_type *)0x10;
  QVar61.m_size = (qsizetype)local_1e8;
  QString::fromLatin1(QVar61);
  ::QVariant::QVariant(&local_80,(QString *)local_1e8);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  if (local_1e8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1e8[0],2,0x10);
    }
  }
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar11.m_data = "QLineEdit";
  QVar11.m_size = 9;
  QString::operator=(&local_128.elementName,QVar11);
  local_168.type = 0x20000000;
  QVar12.m_data = "no-frame";
  QVar12.m_size = 8;
  QString::operator=(&local_168.name,QVar12);
  pQVar2 = &local_128.pseudos;
  QtPrivate::QMovableArrayOps<QCss::Pseudo>::emplace<QCss::Pseudo_const&>
            ((QMovableArrayOps<QCss::Pseudo> *)pQVar2,local_128.pseudos.d.size,&local_168);
  QList<QCss::Pseudo>::end(pQVar2);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(pQVar2);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar13.m_data = "border";
  QVar13.m_size = 6;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar13);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Border;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x27);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar14.m_data = "QFrame";
  QVar14.m_size = 6;
  QString::operator=(&local_128.elementName,QVar14);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar15.m_data = "border";
  QVar15.m_size = 6;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar15);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Border;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar16.m_data = "QLabel";
  QVar16.m_size = 6;
  QString::operator=(&local_128.elementName,QVar16);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar17.m_data = "QToolBox";
  QVar17.m_size = 8;
  QString::operator=(&local_128.elementName,QVar17);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  pQVar1 = &local_b8.declarations;
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar18.m_data = "background";
  QVar18.m_size = 10;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar18);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Background;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x27);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QVar19.m_data = "border-image";
  QVar19.m_size = 0xc;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar19);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = BorderImage;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x27);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar20.m_data = "QGroupBox";
  QVar20.m_size = 9;
  QString::operator=(&local_128.elementName,QVar20);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar21.m_data = "border";
  QVar21.m_size = 6;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar21);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Border;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar22.m_data = "QToolTip";
  QVar22.m_size = 8;
  QString::operator=(&local_128.elementName,QVar22);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar23.m_data = "-qt-background-role";
  QVar23.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar23);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x45);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QVar24.m_data = "border";
  QVar24.m_size = 6;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar24);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Border;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar25.m_data = "QPushButton";
  QVar25.m_size = 0xb;
  QString::operator=(&local_128.elementName,QVar25);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar26.m_data = "QToolButton";
  QVar26.m_size = 0xb;
  QString::operator=(&local_128.elementName,QVar26);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  pQVar1 = &local_b8.declarations;
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar27.m_data = "border-style";
  QVar27.m_size = 0xc;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar27);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = BorderStyles;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  if (!bVar6) {
    QVar28.m_data = "-qt-style-features";
    QVar28.m_size = 0x12;
    QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar28);
    *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtStyleFeatures;
    local_60.type = Identifier;
    QVar62.m_data = (storage_type *)0x10;
    QVar62.m_size = (qsizetype)local_1e8;
    QString::fromLatin1(QVar62);
    ::QVariant::QVariant(&local_80,(QString *)local_1e8);
    ::QVariant::operator=(&local_60.variant,&local_80);
    ::QVariant::~QVariant(&local_80);
    if (local_1e8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1e8[0],2,0x10);
      }
    }
    pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar5,
               *(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),&local_60);
    QList<QCss::Value>::end(pQVar5);
    QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
              ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0
              );
    QList<QCss::Declaration>::end(pQVar1);
    if (*(int *)local_1d0.d.d.ptr != 1) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
    }
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  }
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar29.m_data = "QComboBox";
  QVar29.m_size = 9;
  QString::operator=(&local_128.elementName,QVar29);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar30.m_data = "border";
  QVar30.m_size = 6;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar30);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Border;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  if (!bVar6) {
    QVar31.m_data = "-qt-style-features";
    QVar31.m_size = 0x12;
    QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar31);
    *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtStyleFeatures;
    local_60.type = Identifier;
    QVar63.m_data = (storage_type *)0x10;
    QVar63.m_size = (qsizetype)local_1e8;
    QString::fromLatin1(QVar63);
    ::QVariant::QVariant(&local_80,(QString *)local_1e8);
    ::QVariant::operator=(&local_60.variant,&local_80);
    ::QVariant::~QVariant(&local_80);
    if (local_1e8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1e8[0],2,0x10);
      }
    }
    pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar5,
               *(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),&local_60);
    QList<QCss::Value>::end(pQVar5);
    local_60.type = Identifier;
    QVar64.m_data = (storage_type *)0x13;
    QVar64.m_size = (qsizetype)local_1e8;
    QString::fromLatin1(QVar64);
    ::QVariant::QVariant(&local_80,(QString *)local_1e8);
    ::QVariant::operator=(&local_60.variant,&local_80);
    ::QVariant::~QVariant(&local_80);
    if (local_1e8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1e8[0],2,0x10);
      }
    }
    pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar5,
               *(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),&local_60);
    QList<QCss::Value>::end(pQVar5);
    QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
              ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0
              );
    QList<QCss::Declaration>::end(pQVar1);
    if (*(int *)local_1d0.d.d.ptr != 1) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
    }
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  }
  QVar32.m_data = "-qt-background-role";
  QVar32.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar32);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x44);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  pQVar3 = baseStyle(this);
  lVar4 = (**(code **)(*(long *)pQVar3 + 8))(pQVar3,"QPlastiqueStyle");
  if (lVar4 == 0) {
    pQVar3 = baseStyle(this);
    lVar4 = (**(code **)(*(long *)pQVar3 + 8))(pQVar3,"QCleanlooksStyle");
    if (lVar4 == 0) {
      pQVar3 = baseStyle(this);
      lVar4 = (**(code **)(*(long *)pQVar3 + 8))(pQVar3,"QFusionStyle");
      if (lVar4 == 0) goto LAB_00383913;
    }
  }
  QVar33.m_data = "QComboBox";
  QVar33.m_size = 9;
  QString::operator=(&local_128.elementName,QVar33);
  QVar34.m_data = "readOnly";
  QVar34.m_size = 8;
  QString::operator=(&local_1a8.name,QVar34);
  QVar35.m_data = "true";
  QVar35.m_size = 4;
  QString::operator=(&local_1a8.value,QVar35);
  local_1a8.valueMatchCriterium = MatchEqual;
  this_00 = &local_128.attributeSelectors;
  QtPrivate::QMovableArrayOps<QCss::AttributeSelector>::emplace<QCss::AttributeSelector_const&>
            ((QMovableArrayOps<QCss::AttributeSelector> *)this_00,
             local_128.attributeSelectors.d.size,&local_1a8);
  QList<QCss::AttributeSelector>::end(this_00);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(this_00);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar36.m_data = "-qt-background-role";
  QVar36.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar36);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x3c);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
LAB_00383913:
  QVar37.m_data = "QAbstractSpinBox";
  QVar37.m_size = 0x10;
  QString::operator=(&local_128.elementName,QVar37);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar38.m_data = "border";
  QVar38.m_size = 6;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar38);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Border;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QVar39.m_data = "-qt-style-features";
  QVar39.m_size = 0x12;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar39);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtStyleFeatures;
  local_60.type = Identifier;
  QVar65.m_data = (storage_type *)0x10;
  QVar65.m_size = (qsizetype)local_1e8;
  QString::fromLatin1(QVar65);
  ::QVariant::QVariant(&local_80,(QString *)local_1e8);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  if (local_1e8[0] != (QArrayData *)0x0) {
    LOCK();
    (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1e8[0],2,0x10);
    }
  }
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QVar40.m_data = "-qt-background-role";
  QVar40.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar40);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x44);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar41.m_data = "QMenu";
  QVar41.m_size = 5;
  QString::operator=(&local_128.elementName,QVar41);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar42.m_data = "-qt-background-role";
  QVar42.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar42);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x45);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  if (!bVar6) {
    QVar43.m_data = "QMenu";
    QVar43.m_size = 5;
    QString::operator=(&local_128.elementName,QVar43);
    local_168.type = 0;
    QVar44.m_data = "item";
    QVar44.m_size = 4;
    QString::operator=(&local_168.name,QVar44);
    pQVar2 = &local_128.pseudos;
    QtPrivate::QMovableArrayOps<QCss::Pseudo>::emplace<QCss::Pseudo_const&>
              ((QMovableArrayOps<QCss::Pseudo> *)pQVar2,local_128.pseudos.d.size,&local_168);
    QList<QCss::Pseudo>::end(pQVar2);
    QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
              ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
    QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
    QList<QString>::clear(&local_128.ids);
    QList<QCss::Pseudo>::clear(pQVar2);
    QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
    QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
              ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
               (Selector *)&local_1c8);
    QList<QCss::Selector>::end(&local_b8.selectors);
    QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
    QVar45.m_data = "-qt-style-features";
    QVar45.m_size = 0x12;
    QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar45);
    *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtStyleFeatures;
    local_60.type = Identifier;
    QVar66.m_data = (storage_type *)0x10;
    QVar66.m_size = (qsizetype)local_1e8;
    QString::fromLatin1(QVar66);
    ::QVariant::QVariant(&local_80,(QString *)local_1e8);
    ::QVariant::operator=(&local_60.variant,&local_80);
    ::QVariant::~QVariant(&local_80);
    if (local_1e8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1e8[0],2,0x10);
      }
    }
    pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar5,
               *(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),&local_60);
    QList<QCss::Value>::end(pQVar5);
    QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
              ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0
              );
    QList<QCss::Declaration>::end(pQVar1);
    if (*(int *)local_1d0.d.d.ptr != 1) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
    }
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
    QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
              ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
               (__return_storage_ptr__->styleRules).d.size,&local_b8);
    QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
    QList<QCss::Selector>::clear(&local_b8.selectors);
    QList<QCss::Declaration>::clear(pQVar1);
  }
  QVar46.m_data = "QHeaderView";
  QVar46.m_size = 0xb;
  QString::operator=(&local_128.elementName,QVar46);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar47.m_data = "-qt-background-role";
  QVar47.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar47);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x45);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar48.m_data = "QTableCornerButton";
  QVar48.m_size = 0x12;
  QString::operator=(&local_128.elementName,QVar48);
  local_168.type = 0;
  QVar49.m_data = "section";
  QVar49.m_size = 7;
  QString::operator=(&local_168.name,QVar49);
  pQVar2 = &local_128.pseudos;
  QtPrivate::QMovableArrayOps<QCss::Pseudo>::emplace<QCss::Pseudo_const&>
            ((QMovableArrayOps<QCss::Pseudo> *)pQVar2,local_128.pseudos.d.size,&local_168);
  QList<QCss::Pseudo>::end(pQVar2);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(pQVar2);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar50.m_data = "QHeaderView";
  QVar50.m_size = 0xb;
  QString::operator=(&local_128.elementName,QVar50);
  local_168.type = 0;
  QVar51.m_data = "section";
  QVar51.m_size = 7;
  QString::operator=(&local_168.name,QVar51);
  QtPrivate::QMovableArrayOps<QCss::Pseudo>::emplace<QCss::Pseudo_const&>
            ((QMovableArrayOps<QCss::Pseudo> *)pQVar2,local_128.pseudos.d.size,&local_168);
  QList<QCss::Pseudo>::end(pQVar2);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  pQVar1 = &local_b8.declarations;
  QList<QCss::Pseudo>::clear(pQVar2);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar52.m_data = "-qt-background-role";
  QVar52.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar52);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x3c);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  if (!bVar6) {
    QVar53.m_data = "-qt-style-features";
    QVar53.m_size = 0x12;
    QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar53);
    *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtStyleFeatures;
    local_60.type = Identifier;
    QVar67.m_data = (storage_type *)0x10;
    QVar67.m_size = (qsizetype)local_1e8;
    QString::fromLatin1(QVar67);
    ::QVariant::QVariant(&local_80,(QString *)local_1e8);
    ::QVariant::operator=(&local_60.variant,&local_80);
    ::QVariant::~QVariant(&local_80);
    if (local_1e8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1e8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1e8[0],2,0x10);
      }
    }
    pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
    QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
              ((QMovableArrayOps<QCss::Value> *)pQVar5,
               *(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),&local_60);
    QList<QCss::Value>::end(pQVar5);
    QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
              ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0
              );
    QList<QCss::Declaration>::end(pQVar1);
    if (*(int *)local_1d0.d.d.ptr != 1) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
    }
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  }
  QVar54.m_data = "border";
  QVar54.m_size = 6;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar54);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Border;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar55.m_data = "QProgressBar";
  QVar55.m_size = 0xc;
  QString::operator=(&local_128.elementName,QVar55);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar56.m_data = "-qt-background-role";
  QVar56.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar56);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x44);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar57.m_data = "QScrollBar";
  QVar57.m_size = 10;
  QString::operator=(&local_128.elementName,QVar57);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar58.m_data = "-qt-background-role";
  QVar58.m_size = 0x13;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar58);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = QtBackgroundRole;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x45);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  QVar59.m_data = "QDockWidget";
  QVar59.m_size = 0xb;
  QString::operator=(&local_128.elementName,QVar59);
  QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
            ((QMovableArrayOps<QCss::BasicSelector> *)&local_1c8,local_1c8.size,&local_128);
  QList<QCss::BasicSelector>::end((QList<QCss::BasicSelector> *)&local_1c8);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
            ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.selectors.d.size,
             (Selector *)&local_1c8);
  QList<QCss::Selector>::end(&local_b8.selectors);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QVar60.m_data = "border";
  QVar60.m_size = 6;
  QString::operator=((QString *)((long)local_1d0.d.d.ptr + 8),QVar60);
  *(Property *)((long)local_1d0.d.d.ptr + 0x20) = Border;
  local_60.type = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=(&local_60.variant,&local_80);
  ::QVariant::~QVariant(&local_80);
  pQVar5 = (QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28);
  QtPrivate::QMovableArrayOps<QCss::Value>::emplace<QCss::Value_const&>
            ((QMovableArrayOps<QCss::Value> *)pQVar5,*(qsizetype *)((long)local_1d0.d.d.ptr + 0x38),
             &local_60);
  QList<QCss::Value>::end(pQVar5);
  QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
            ((QMovableArrayOps<QCss::Declaration> *)pQVar1,local_b8.declarations.d.size,&local_1d0);
  QList<QCss::Declaration>::end(pQVar1);
  if (*(int *)local_1d0.d.d.ptr != 1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper(&local_1d0.d);
  }
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)local_1d0.d.d.ptr + 0x28));
  QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
            ((QMovableArrayOps<QCss::StyleRule> *)__return_storage_ptr__,
             (__return_storage_ptr__->styleRules).d.size,&local_b8);
  QList<QCss::StyleRule>::end(&__return_storage_ptr__->styleRules);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar1);
  __return_storage_ptr__->origin = StyleSheetOrigin_UserAgent;
  QCss::StyleSheet::buildIndexes((CaseSensitivity)__return_storage_ptr__);
  if (&(local_1a8.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1a8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1a8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1a8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_1a8.value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1a8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1a8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1a8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1a8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1a8.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_168.function.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_168.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_168.function.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_168.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_168.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_168.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  ::QVariant::~QVariant(&local_60.variant);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::~QExplicitlySharedDataPointer
            (&local_1d0.d);
  QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_1c8);
  QArrayDataPointer<QCss::AttributeSelector>::~QArrayDataPointer(&local_128.attributeSelectors.d);
  QArrayDataPointer<QCss::Pseudo>::~QArrayDataPointer(&local_128.pseudos.d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_128.ids.d);
  if (&(local_128.elementName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.elementName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.elementName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_128.elementName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_128.elementName.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&pQVar1->d);
  QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::Selector> *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

StyleSheet QStyleSheetStyle::getDefaultStyleSheet() const
{
    StyleSheet sheet;
    StyleRule styleRule;
    BasicSelector bSelector;
    Selector selector;
    Declaration decl;
    QCss::Value value;
    Pseudo pseudo;
    AttributeSelector attr;

    // pixmap based style doesn't support any features
    bool styleIsPixmapBased = baseStyle()->inherits("QMacStyle")
            || (baseStyle()->inherits("QWindowsVistaStyle")
                && !baseStyle()->inherits("QWindows11Style"));


    /*QLineEdit {
        -qt-background-role: base;
        border: native;
        -qt-style-features: background-color;
    }*/
    {
        SET_ELEMENT_NAME("QLineEdit"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QLineEdit:no-frame {
        border: none;
    }*/
    {
        SET_ELEMENT_NAME("QLineEdit"_L1);
        ADD_PSEUDO("no-frame"_L1, PseudoClass_Frameless);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QFrame {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QFrame"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QLabel, QToolBox {
        background: none;
        border-image: none;
    }*/
    {
        SET_ELEMENT_NAME("QLabel"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QToolBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("background"_L1, Background);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        SET_PROPERTY("border-image"_L1, BorderImage);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QGroupBox {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QGroupBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }


    /*QToolTip {
        -qt-background-role: window;
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QToolTip"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QPushButton, QToolButton {
        border-style: native;
        -qt-style-features: background-color;  //only for not pixmap based styles
    }*/
    {
        SET_ELEMENT_NAME("QPushButton"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QToolButton"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border-style"_L1, BorderStyles);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_DECLARATION;
        }


        ADD_STYLE_RULE;
    }


    /*QComboBox {
        border: native;
        -qt-style-features: background-color background-gradient;   //only for not pixmap based styles
        -qt-background-role: base;
    }*/

    {
        SET_ELEMENT_NAME("QComboBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-gradient"));
            ADD_DECLARATION;
        }

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QComboBox[style="QPlastiqueStyle"][readOnly="true"],
    QComboBox[style="QFusionStyle"][readOnly="true"],
    QComboBox[style="QCleanlooksStyle"][readOnly="true"]
    {
        -qt-background-role: button;
    }*/
    if (baseStyle()->inherits("QPlastiqueStyle")  || baseStyle()->inherits("QCleanlooksStyle") || baseStyle()->inherits("QFusionStyle"))
    {
        SET_ELEMENT_NAME("QComboBox"_L1);
        ADD_ATTRIBUTE_SELECTOR("readOnly"_L1, "true"_L1, AttributeSelector::MatchEqual);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Button);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QAbstractSpinBox {
        border: native;
        -qt-style-features: background-color;
        -qt-background-role: base;
    }*/
    {
        SET_ELEMENT_NAME("QAbstractSpinBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QMenu {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QMenu"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }
    /*QMenu::item {
        -qt-style-features: background-color;
    }*/
    if (!styleIsPixmapBased) {
        SET_ELEMENT_NAME("QMenu"_L1);
        ADD_PSEUDO("item"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QHeaderView {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QHeaderView"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QTableCornerButton::section, QHeaderView::section {
        -qt-background-role: button;
        -qt-style-features: background-color; //if style is not pixmap based
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QTableCornerButton"_L1);
        ADD_PSEUDO("section"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QHeaderView"_L1);
        ADD_PSEUDO("section"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Button);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_DECLARATION;
        }

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QProgressBar {
        -qt-background-role: base;
    }*/
    {
        SET_ELEMENT_NAME("QProgressBar"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QScrollBar {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QScrollBar"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QDockWidget {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QDockWidget"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    sheet.origin = StyleSheetOrigin_UserAgent;
    sheet.buildIndexes();
    return sheet;
}